

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlcrc.c
# Opt level: O2

void EBML_CRCAddBuffer(ebml_crc *CRC,void *Buf,size_t Size)

{
  ulong uVar1;
  uint uVar2;
  
  for (; 3 < Size; Size = Size - 4) {
    uVar2 = CRC->CRC ^ *Buf;
    uVar2 = uVar2 >> 8 ^ m_tab[uVar2 & 0xff];
    uVar2 = uVar2 >> 8 ^ m_tab[uVar2 & 0xff];
    uVar2 = uVar2 >> 8 ^ m_tab[uVar2 & 0xff];
    CRC->CRC = uVar2 >> 8 ^ m_tab[uVar2 & 0xff];
    Buf = (void *)((long)Buf + 4);
  }
  for (uVar1 = 0; Size != uVar1; uVar1 = uVar1 + 1) {
    CRC->CRC = CRC->CRC >> 8 ^ m_tab[(uint)*(byte *)((long)Buf + uVar1) ^ CRC->CRC & 0xff];
  }
  return;
}

Assistant:

void EBML_CRCAddBuffer(ebml_crc *CRC, const void *Buf, size_t Size)
{
	const uint32_t *Buf32 = Buf;
	while (Size >= 4)
	{
		CRC->CRC ^= *Buf32;
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		Size -= 4;
		Buf32++;
	}

	const uint8_t *Buf8 = (const uint8_t *)Buf32;
	while (Size--)
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC) ^ *Buf8++] ^ CRC32_SHIFTED(CRC->CRC);
}